

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O0

Vec2i __thiscall embree::XMLLoader::load<embree::Vec2<int>>(XMLLoader *this,Ref<embree::XML> *xml)

{
  int iVar1;
  int iVar2;
  size_type sVar3;
  runtime_error *this_00;
  long *in_RDX;
  anon_union_8_2_4062524c_for_Vec2<int>_1 in_RDI;
  char *__rhs;
  anon_union_8_2_4062524c_for_Vec2<int>_1 __lhs;
  Token *in_stack_ffffffffffffff90;
  ParseLocation *in_stack_ffffffffffffffe8;
  
  __lhs = in_RDI;
  sVar3 = std::vector<embree::Token,_std::allocator<embree::Token>_>::size
                    ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*in_RDX + 0x98));
  if (sVar3 != 2) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    __rhs = (char *)*in_RDX;
    ParseLocation::str_abi_cxx11_(in_stack_ffffffffffffffe8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,__rhs)
    ;
    std::runtime_error::runtime_error(this_00,(string *)&stack0xffffffffffffff90);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
            ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*in_RDX + 0x98),0);
  iVar1 = Token::Int(in_stack_ffffffffffffff90);
  std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
            ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*in_RDX + 0x98),1);
  iVar2 = Token::Int(in_stack_ffffffffffffff90);
  *(int *)__lhs = iVar1;
  *(int *)((long)__lhs + 4) = iVar2;
  return (Vec2i)in_RDI;
}

Assistant:

Vec2i XMLLoader::load<Vec2i>(const Ref<XML>& xml) {
    if (xml->body.size() != 2) THROW_RUNTIME_ERROR(xml->loc.str()+": wrong int2 body");
    return Vec2i(xml->body[0].Int(),xml->body[1].Int());
  }